

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall V1Transport::V1Transport(V1Transport *this,NodeId node_id)

{
  uint256 *puVar1;
  base_blob<256U> *pbVar2;
  CChainParams *pCVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock37;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__V1Transport_00b104c8;
  pCVar3 = Params();
  *(undefined4 *)(this->m_magic_bytes)._M_elems = *(undefined4 *)(pCVar3->pchMessageStart)._M_elems;
  this->m_node_id = node_id;
  (this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_recv_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  CSHA256::CSHA256(&(this->hasher).sha);
  local_28._M_device = &(this->m_recv_mutex).super_mutex;
  pbVar2 = &(this->data_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  pbVar2 = &(this->data_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &this->data_hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &(this->data_hash).super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  (this->hdrbuf).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hdrbuf).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hdrbuf).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hdrbuf).m_read_pos = 0;
  (this->hdr).pchMessageStart = (_Type)0x0;
  (this->hdr).pchCommand[0] = '\0';
  (this->hdr).pchCommand[1] = '\0';
  (this->hdr).pchCommand[2] = '\0';
  (this->hdr).pchCommand[3] = '\0';
  (this->hdr).pchCommand[4] = '\0';
  (this->hdr).pchCommand[5] = '\0';
  (this->hdr).pchCommand[6] = '\0';
  (this->hdr).pchCommand[7] = '\0';
  (this->hdr).pchCommand[8] = '\0';
  (this->hdr).pchCommand[9] = '\0';
  (this->hdr).pchCommand[10] = '\0';
  (this->hdr).pchCommand[0xb] = '\0';
  (this->hdr).nMessageSize = 0xffffffff;
  *(undefined8 *)(this->hdr).pchChecksum = 0;
  *(undefined8 *)
   ((long)&(this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined4 *)((long)&(this->vRecv).m_read_pos + 4) = 0;
  (this->m_send_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_send_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_send_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_send_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_send_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_header_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_header_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_header_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_message_to_send).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_message_to_send).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_message_to_send).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_message_to_send).m_type._M_dataplus._M_p =
       (pointer)&(this->m_message_to_send).m_type.field_2;
  (this->m_message_to_send).m_type._M_string_length = 0;
  (this->m_message_to_send).m_type.field_2._M_local_buf[0] = '\0';
  this->m_sending_header = false;
  this->m_bytes_sent = 0;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  Reset(this);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

V1Transport::V1Transport(const NodeId node_id) noexcept
    : m_magic_bytes{Params().MessageStart()}, m_node_id{node_id}
{
    LOCK(m_recv_mutex);
    Reset();
}